

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

char * bson_iter_dup_utf8(bson_iter_t *iter,uint32_t *length)

{
  char *__src;
  char *local_30;
  char *ret;
  char *str;
  uint32_t *puStack_18;
  uint32_t local_length;
  uint32_t *length_local;
  bson_iter_t *iter_local;
  
  str._4_4_ = 0;
  local_30 = (char *)0x0;
  puStack_18 = length;
  length_local = (uint32_t *)iter;
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x522,"bson_iter_dup_utf8","iter");
    abort();
  }
  __src = bson_iter_utf8(iter,(uint32_t *)((long)&str + 4));
  if (__src != (char *)0x0) {
    local_30 = (char *)bson_malloc0((ulong)(str._4_4_ + 1));
    memcpy(local_30,__src,(ulong)str._4_4_);
    local_30[str._4_4_] = '\0';
  }
  if (puStack_18 != (uint32_t *)0x0) {
    *puStack_18 = str._4_4_;
  }
  return local_30;
}

Assistant:

char *
bson_iter_dup_utf8 (const bson_iter_t *iter, /* IN */
                    uint32_t *length)        /* OUT */
{
   uint32_t local_length = 0;
   const char *str;
   char *ret = NULL;

   BSON_ASSERT (iter);

   if ((str = bson_iter_utf8 (iter, &local_length))) {
      ret = bson_malloc0 (local_length + 1);
      memcpy (ret, str, local_length);
      ret[local_length] = '\0';
   }

   if (length) {
      *length = local_length;
   }

   return ret;
}